

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool execAdbCommand(QStringList *args,QByteArray *output,bool verbose)

{
  bool bVar1;
  long lVar2;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  initializer_list<QString> args_00;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<char16_t> local_58;
  Data *local_40;
  char16_t *local_38;
  qsizetype qStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (g_options.serial.d.size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      bVar1 = execCommand(&g_options.adbCommand,args,output,verbose);
      return bVar1;
    }
  }
  else {
    local_78.size = -0x5555555555555556;
    local_78.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_78.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
    latin1.m_data = "-s";
    latin1.m_size = 2;
    QString::QString((QString *)&local_58,latin1);
    local_40 = g_options.serial.d.d;
    local_38 = g_options.serial.d.ptr;
    qStack_30 = g_options.serial.d.size;
    if (g_options.serial.d.d != (Data *)0x0) {
      LOCK();
      ((g_options.serial.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((g_options.serial.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    args_00._M_len = 2;
    args_00._M_array = (iterator)&local_58;
    QList<QString>::QList((QList<QString> *)&local_78,args_00);
    lVar2 = 0x18;
    do {
      QArrayDataPointer<char16_t>::~QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)((long)&local_58.d + lVar2));
      lVar2 = lVar2 + -0x18;
    } while (lVar2 != -0x18);
    QList<QString>::append((QList<QString> *)&local_78,args);
    bVar1 = execCommand(&g_options.adbCommand,(QStringList *)&local_78,output,verbose);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return bVar1;
    }
  }
  __stack_chk_fail();
}

Assistant:

static bool execAdbCommand(const QStringList &args, QByteArray *output = nullptr,
                           bool verbose = true)
{
    if (g_options.serial.isEmpty())
        return execCommand(g_options.adbCommand, args, output, verbose);

    QStringList argsWithSerial = {"-s"_L1, g_options.serial};
    argsWithSerial.append(args);

    return execCommand(g_options.adbCommand, argsWithSerial, output, verbose);
}